

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irExpression *
build_ir_call(Context_conflict *ctx,MOJOSHADER_astExpressionCallFunction *ast)

{
  MOJOSHADER_astDataTypeType MVar1;
  int iVar2;
  int iVar3;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar4;
  MOJOSHADER_irExprList *pMVar5;
  MOJOSHADER_irExpression *pMVar6;
  
  dt = reduce_datatype(ctx,ast->datatype);
  pMVar4 = datatype_base(ctx,dt);
  MVar1 = pMVar4->type;
  iVar3 = datatype_elems(ctx,dt);
  iVar2 = ast->identifier->index;
  pMVar5 = build_ir_exprlist(ctx,ast->args);
  pMVar6 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x30,ctx->malloc_data);
  if (pMVar6 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar6 = (MOJOSHADER_irExpression *)0x0;
  }
  else {
    (pMVar6->ir).type = MOJOSHADER_IR_CALL;
    (pMVar6->ir).filename = ctx->sourcefile;
    (pMVar6->ir).line = ctx->sourceline;
    (pMVar6->info).type = MVar1;
    (pMVar6->info).elements = iVar3;
    (pMVar6->call).args = pMVar5;
    (pMVar6->temp).index = iVar2;
  }
  return pMVar6;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_call(Context *ctx, const MOJOSHADER_astExpressionCallFunction *ast)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, ast->datatype);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    return new_ir_call(ctx, ast->identifier->index, build_ir_exprlist(ctx, ast->args), type, elems);
}